

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O3

uint Lpk_ComputeSets_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t *vSets)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint Entry;
  uint uVar7;
  uint uVar8;
  uint uSupps [16];
  uint local_68 [16];
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar6 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar1 <= uVar6) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if ((uVar6 < uVar1) ||
     (pKVar3 = p->pNodes[(ulong)uVar6 - (ulong)uVar1], pKVar3 == (Kit_DsdObj_t *)0x0)) {
    uVar6 = 1 << ((byte)uVar6 & 0x1f);
  }
  else {
    KVar2 = *pKVar3;
    uVar6 = (uint)KVar2 >> 6 & 7;
    if (uVar6 - 3 < 2) {
      if ((uint)KVar2 < 0x4000000) {
        uVar4 = (ulong)((uint)KVar2 >> 0x1a);
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        uVar6 = 0;
        do {
          uVar8 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)((long)&pKVar3[1].field_0x0 + uVar5 * 2),
                                      vSets);
          local_68[uVar5] = uVar8;
          uVar6 = uVar6 | uVar8;
          uVar5 = uVar5 + 1;
          uVar4 = (ulong)((uint)*pKVar3 >> 0x1a);
        } while (uVar5 < uVar4);
      }
      uVar8 = -1 << ((byte)uVar4 & 0x1f);
      if (uVar8 < 0xfffffffe) {
        uVar7 = 1;
        do {
          Entry = 0;
          if (0x3ffffff < (uint)*pKVar3) {
            uVar5 = 0;
            Entry = 0;
            do {
              if ((uVar7 >> ((uint)uVar5 & 0x1f) & 1) != 0) {
                Entry = Entry | local_68[uVar5];
              }
              uVar5 = uVar5 + 1;
            } while ((uint)*pKVar3 >> 0x1a != uVar5);
          }
          Vec_IntPush(vSets,Entry);
          uVar7 = uVar7 + 1;
        } while ((uVar8 ^ uVar7) != 0xffffffff);
      }
    }
    else {
      if (uVar6 != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                      ,0x55,"unsigned int Lpk_ComputeSets_rec(Kit_DsdNtk_t *, int, Vec_Int_t *)");
      }
      uVar6 = 0;
      if (0x3ffffff < (uint)KVar2) {
        uVar5 = 0;
        uVar6 = 0;
        do {
          uVar8 = Lpk_ComputeSets_rec(p,(uint)*(ushort *)((long)&pKVar3[1].field_0x0 + uVar5 * 2),
                                      vSets);
          uVar6 = uVar6 | uVar8;
          Vec_IntPush(vSets,uVar8);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (uint)*pKVar3 >> 0x1a);
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned Lpk_ComputeSets_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t * vSets )
{
    unsigned i, iLitFanin, uSupport, uSuppCur;
    Kit_DsdObj_t * pObj;
    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return (1 << Abc_Lit2Var(iLit));
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        unsigned uSupps[16], Limit, s;
        uSupport = 0;
        Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        {
            uSupps[i] = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
            uSupport |= uSupps[i];
        }
        // create all subsets, except empty and full
        Limit = (1 << pObj->nFans) - 1;
        for ( s = 1; s < Limit; s++ )
        {
            uSuppCur = 0;
            for ( i = 0; i < pObj->nFans; i++ )
                if ( s & (1 << i) )
                    uSuppCur |= uSupps[i];
            Vec_IntPush( vSets, uSuppCur );
        }
        return uSupport;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    // get the cumulative support of all fanins
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
    {
        uSuppCur  = Lpk_ComputeSets_rec( p, iLitFanin, vSets );
        uSupport |= uSuppCur;
        Vec_IntPush( vSets, uSuppCur );
    }
    return uSupport;
}